

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void __thiscall QSslSocket::QSslSocket(QSslSocket *this,QObject *parent)

{
  QSslSocketPrivate *this_00;
  QSslSocketPrivate *this_01;
  
  this_01 = (QSslSocketPrivate *)operator_new(0x410);
  QSslSocketPrivate::QSslSocketPrivate(this_01);
  QTcpSocket::QTcpSocket(&this->super_QTcpSocket,(QTcpSocketPrivate *)this_01,parent);
  *(undefined ***)&(this->super_QTcpSocket).super_QAbstractSocket = &PTR_metaObject_002cfa08;
  this_00 = *(QSslSocketPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  *(QSslSocket **)&(this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x8 = this;
  QSslSocketPrivate::init(this_00,(EVP_PKEY_CTX *)this_01);
  return;
}

Assistant:

QSslSocket::QSslSocket(QObject *parent)
    : QTcpSocket(*new QSslSocketPrivate, parent)
{
    Q_D(QSslSocket);
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::QSslSocket(" << parent << "), this =" << (void *)this;
#endif
    d->q_ptr = this;
    d->init();
}